

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O0

JsonBool * __thiscall json::JsonArray::setBool(JsonArray *this,size_t index,bool value)

{
  JsonBool *pJVar1;
  unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *this_00;
  reference this_01;
  type this_02;
  unique_ptr<json::JsonBool,_std::default_delete<json::JsonBool>_> local_28;
  byte local_19;
  size_t sStack_18;
  bool value_local;
  size_t index_local;
  JsonArray *this_local;
  
  local_19 = value;
  sStack_18 = index;
  index_local = (size_t)this;
  pJVar1 = (JsonBool *)operator_new(0x18);
  JsonBool::JsonBool(pJVar1,&this->super_JsonNode,(bool)(local_19 & 1));
  std::unique_ptr<json::JsonBool,std::default_delete<json::JsonBool>>::
  unique_ptr<std::default_delete<json::JsonBool>,void>
            ((unique_ptr<json::JsonBool,std::default_delete<json::JsonBool>> *)&local_28,pJVar1);
  this_00 = (unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *)
            std::
            vector<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>,_std::allocator<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>_>_>
            ::operator[](&this->children,sStack_18);
  std::unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>>::operator=(this_00,&local_28);
  std::unique_ptr<json::JsonBool,_std::default_delete<json::JsonBool>_>::~unique_ptr(&local_28);
  this_01 = std::
            vector<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>,_std::allocator<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>_>_>
            ::operator[](&this->children,sStack_18);
  this_02 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                      (this_01);
  pJVar1 = JsonNode::operator_cast_to_JsonBool_(this_02);
  return pJVar1;
}

Assistant:

JsonBool &JsonArray::setBool(size_t index, bool value)
    {
        children[index] = std::unique_ptr<JsonBool>(new JsonBool(this, value));
        return *children[index];
    }